

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

void read_random_seed(noise_consumer_t consumer)

{
  int __fd;
  char *__file;
  ssize_t sVar1;
  char buf [512];
  
  __file = make_filename(3,(char *)0x0);
  __fd = open(__file,0);
  safefree(__file);
  if (-1 < __fd) {
    while (sVar1 = read(__fd,buf,0x200), 0 < (int)sVar1) {
      (*consumer)(buf,(int)sVar1);
    }
    close(__fd);
  }
  return;
}

Assistant:

void read_random_seed(noise_consumer_t consumer)
{
    int fd;
    char *fname;

    fname = make_filename(INDEX_RANDSEED, NULL);
    fd = open(fname, O_RDONLY);
    sfree(fname);
    if (fd >= 0) {
        char buf[512];
        int ret;
        while ( (ret = read(fd, buf, sizeof(buf))) > 0)
            consumer(buf, ret);
        close(fd);
    }
}